

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage9_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  uint uVar49;
  undefined4 uVar50;
  char in_DL;
  long in_RSI;
  undefined1 (*in_RDI) [16];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i _in1_19;
  __m128i _in0_19;
  __m128i _in1_18;
  __m128i _in0_18;
  __m128i _in1_17;
  __m128i _in0_17;
  __m128i _in1_16;
  __m128i _in0_16;
  __m128i _in1_15;
  __m128i _in0_15;
  __m128i _in1_14;
  __m128i _in0_14;
  __m128i _in1_13;
  __m128i _in0_13;
  __m128i _in1_12;
  __m128i _in0_12;
  __m128i _in1_11;
  __m128i _in0_11;
  __m128i _in1_10;
  __m128i _in0_10;
  __m128i _in1_9;
  __m128i _in0_9;
  __m128i _in1_8;
  __m128i _in0_8;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_7;
  __m128i _in0_7;
  __m128i _in1_6;
  __m128i _in0_6;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i cospi_p32_p32;
  __m128i cospi_m32_p32;
  undefined2 local_e48;
  undefined2 uStack_e46;
  undefined2 uStack_e44;
  undefined2 uStack_e42;
  undefined2 local_e38;
  undefined2 uStack_e36;
  undefined2 uStack_e34;
  undefined2 uStack_e32;
  undefined2 local_e28;
  undefined2 uStack_e26;
  undefined2 uStack_e24;
  undefined2 uStack_e22;
  undefined2 local_e18;
  undefined2 uStack_e16;
  undefined2 uStack_e14;
  undefined2 uStack_e12;
  undefined2 local_e08;
  undefined2 uStack_e06;
  undefined2 uStack_e04;
  undefined2 uStack_e02;
  undefined2 local_df8;
  undefined2 uStack_df6;
  undefined2 uStack_df4;
  undefined2 uStack_df2;
  undefined2 local_de8;
  undefined2 uStack_de6;
  undefined2 uStack_de4;
  undefined2 uStack_de2;
  undefined2 local_dd8;
  undefined2 uStack_dd6;
  undefined2 uStack_dd4;
  undefined2 uStack_dd2;
  undefined2 uStack_dc0;
  undefined2 uStack_dbe;
  undefined2 uStack_dbc;
  undefined2 uStack_dba;
  undefined2 uStack_db0;
  undefined2 uStack_dae;
  undefined2 uStack_dac;
  undefined2 uStack_daa;
  undefined2 uStack_da0;
  undefined2 uStack_d9e;
  undefined2 uStack_d9c;
  undefined2 uStack_d9a;
  undefined2 uStack_d90;
  undefined2 uStack_d8e;
  undefined2 uStack_d8c;
  undefined2 uStack_d8a;
  undefined2 uStack_d80;
  undefined2 uStack_d7e;
  undefined2 uStack_d7c;
  undefined2 uStack_d7a;
  undefined2 uStack_d70;
  undefined2 uStack_d6e;
  undefined2 uStack_d6c;
  undefined2 uStack_d6a;
  undefined2 uStack_d60;
  undefined2 uStack_d5e;
  undefined2 uStack_d5c;
  undefined2 uStack_d5a;
  undefined2 uStack_d50;
  undefined2 uStack_d4e;
  undefined2 uStack_d4c;
  undefined2 uStack_d4a;
  int local_b38;
  int iStack_b34;
  int iStack_b30;
  int iStack_b2c;
  int local_b18;
  int iStack_b14;
  int iStack_b10;
  int iStack_b0c;
  int local_af8;
  int iStack_af4;
  int iStack_af0;
  int iStack_aec;
  int local_ad8;
  int iStack_ad4;
  int iStack_ad0;
  int iStack_acc;
  int local_ab8;
  int iStack_ab4;
  int iStack_ab0;
  int iStack_aac;
  int local_a98;
  int iStack_a94;
  int iStack_a90;
  int iStack_a8c;
  int local_a78;
  int iStack_a74;
  int iStack_a70;
  int iStack_a6c;
  int local_a58;
  int iStack_a54;
  int iStack_a50;
  int iStack_a4c;
  int local_a38;
  int iStack_a34;
  int iStack_a30;
  int iStack_a2c;
  int local_a18;
  int iStack_a14;
  int iStack_a10;
  int iStack_a0c;
  int local_9f8;
  int iStack_9f4;
  int iStack_9f0;
  int iStack_9ec;
  int local_9d8;
  int iStack_9d4;
  int iStack_9d0;
  int iStack_9cc;
  int local_9b8;
  int iStack_9b4;
  int iStack_9b0;
  int iStack_9ac;
  int local_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  int local_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  __m128i _in1_23;
  __m128i _in0_23;
  __m128i _in1_22;
  __m128i _in0_22;
  __m128i _in1_21;
  __m128i _in0_21;
  __m128i _in1_20;
  __m128i _in0_20;
  
  uVar49 = -*(int *)(in_RSI + 0x80) & 0xffffU | *(int *)(in_RSI + 0x80) << 0x10;
  uVar45 = CONCAT44(uVar49,uVar49);
  uVar46 = CONCAT44(uVar49,uVar49);
  uVar50 = CONCAT22(*(undefined2 *)(in_RSI + 0x80),*(undefined2 *)(in_RSI + 0x80));
  uVar47 = CONCAT44(uVar50,uVar50);
  uVar48 = CONCAT44(uVar50,uVar50);
  auVar52 = *in_RDI;
  auVar51 = paddsw(*in_RDI,in_RDI[0xf]);
  *in_RDI = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xf]);
  in_RDI[0xf] = auVar52;
  auVar52 = in_RDI[1];
  auVar51 = paddsw(in_RDI[1],in_RDI[0xe]);
  in_RDI[1] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xe]);
  in_RDI[0xe] = auVar52;
  auVar52 = in_RDI[2];
  auVar51 = paddsw(in_RDI[2],in_RDI[0xd]);
  in_RDI[2] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xd]);
  in_RDI[0xd] = auVar52;
  auVar52 = in_RDI[3];
  auVar51 = paddsw(in_RDI[3],in_RDI[0xc]);
  in_RDI[3] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xc]);
  in_RDI[0xc] = auVar52;
  auVar52 = in_RDI[4];
  auVar51 = paddsw(in_RDI[4],in_RDI[0xb]);
  in_RDI[4] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0xb]);
  in_RDI[0xb] = auVar52;
  auVar52 = in_RDI[5];
  auVar51 = paddsw(in_RDI[5],in_RDI[10]);
  in_RDI[5] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[10]);
  in_RDI[10] = auVar52;
  auVar52 = in_RDI[6];
  auVar51 = paddsw(in_RDI[6],in_RDI[9]);
  in_RDI[6] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[9]);
  in_RDI[9] = auVar52;
  auVar52 = in_RDI[7];
  auVar51 = paddsw(in_RDI[7],in_RDI[8]);
  in_RDI[7] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[8]);
  in_RDI[8] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x14];
  uVar2 = *(undefined8 *)in_RDI[0x1b];
  local_dd8 = (undefined2)uVar1;
  uStack_dd6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_dd4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_dd2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_de8 = (undefined2)uVar2;
  uStack_de6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_de4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_de2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x14] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x1b] + 8);
  uStack_d50 = (undefined2)uVar1;
  uStack_d4e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_d4c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_d4a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_d60 = (undefined2)uVar2;
  uStack_d5e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_d5c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_d5a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_de8;
  auVar28._0_2_ = local_dd8;
  auVar28._4_2_ = uStack_dd6;
  auVar28._6_2_ = uStack_de6;
  auVar28._10_2_ = uStack_de4;
  auVar28._8_2_ = uStack_dd4;
  auVar28._12_2_ = uStack_dd2;
  auVar28._14_2_ = uStack_de2;
  auVar27._8_8_ = uVar46;
  auVar27._0_8_ = uVar45;
  auVar52 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_d60;
  auVar26._0_2_ = uStack_d50;
  auVar26._4_2_ = uStack_d4e;
  auVar26._6_2_ = uStack_d5e;
  auVar26._10_2_ = uStack_d5c;
  auVar26._8_2_ = uStack_d4c;
  auVar26._12_2_ = uStack_d4a;
  auVar26._14_2_ = uStack_d5a;
  auVar25._8_8_ = uVar46;
  auVar25._0_8_ = uVar45;
  auVar51 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_de8;
  auVar24._0_2_ = local_dd8;
  auVar24._4_2_ = uStack_dd6;
  auVar24._6_2_ = uStack_de6;
  auVar24._10_2_ = uStack_de4;
  auVar24._8_2_ = uStack_dd4;
  auVar24._12_2_ = uStack_dd2;
  auVar24._14_2_ = uStack_de2;
  auVar23._8_8_ = uVar48;
  auVar23._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_d60;
  auVar22._0_2_ = uStack_d50;
  auVar22._4_2_ = uStack_d4e;
  auVar22._6_2_ = uStack_d5e;
  auVar22._10_2_ = uStack_d5c;
  auVar22._8_2_ = uStack_d4c;
  auVar22._12_2_ = uStack_d4a;
  auVar22._14_2_ = uStack_d5a;
  auVar21._8_8_ = uVar48;
  auVar21._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar22,auVar21);
  local_958 = auVar52._0_4_;
  iStack_954 = auVar52._4_4_;
  iStack_950 = auVar52._8_4_;
  iStack_94c = auVar52._12_4_;
  local_968 = (int)in_XMM0_Qa;
  iStack_964 = (int)((ulong)in_XMM0_Qa >> 0x20);
  iStack_960 = (int)in_XMM0_Qb;
  iStack_95c = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_978 = auVar51._0_4_;
  iStack_974 = auVar51._4_4_;
  iStack_970 = auVar51._8_4_;
  iStack_96c = auVar51._12_4_;
  local_998 = auVar53._0_4_;
  iStack_994 = auVar53._4_4_;
  iStack_990 = auVar53._8_4_;
  iStack_98c = auVar53._12_4_;
  local_9b8 = auVar54._0_4_;
  iStack_9b4 = auVar54._4_4_;
  iStack_9b0 = auVar54._8_4_;
  iStack_9ac = auVar54._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar44._4_4_ = iStack_954 + iStack_964 >> auVar52;
  auVar44._0_4_ = local_958 + local_968 >> auVar52;
  auVar44._12_4_ = iStack_94c + iStack_95c >> auVar52;
  auVar44._8_4_ = iStack_950 + iStack_960 >> auVar52;
  auVar43._4_4_ = iStack_974 + iStack_964 >> auVar51;
  auVar43._0_4_ = local_978 + local_968 >> auVar51;
  auVar43._12_4_ = iStack_96c + iStack_95c >> auVar51;
  auVar43._8_4_ = iStack_970 + iStack_960 >> auVar51;
  auVar52 = packssdw(auVar44,auVar43);
  in_RDI[0x14] = auVar52;
  auVar42._4_4_ = iStack_994 + iStack_964 >> auVar53;
  auVar42._0_4_ = local_998 + local_968 >> auVar53;
  auVar42._12_4_ = iStack_98c + iStack_95c >> auVar53;
  auVar42._8_4_ = iStack_990 + iStack_960 >> auVar53;
  auVar41._4_4_ = iStack_9b4 + iStack_964 >> auVar54;
  auVar41._0_4_ = local_9b8 + local_968 >> auVar54;
  auVar41._12_4_ = iStack_9ac + iStack_95c >> auVar54;
  auVar41._8_4_ = iStack_9b0 + iStack_960 >> auVar54;
  auVar52 = packssdw(auVar42,auVar41);
  in_RDI[0x1b] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x15];
  uVar2 = *(undefined8 *)in_RDI[0x1a];
  local_df8 = (undefined2)uVar1;
  uStack_df6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_df4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_df2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_e08 = (undefined2)uVar2;
  uStack_e06 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_e04 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_e02 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x15] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x1a] + 8);
  uStack_d70 = (undefined2)uVar1;
  uStack_d6e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_d6c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_d6a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_d80 = (undefined2)uVar2;
  uStack_d7e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_d7c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_d7a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_e08;
  auVar20._0_2_ = local_df8;
  auVar20._4_2_ = uStack_df6;
  auVar20._6_2_ = uStack_e06;
  auVar20._10_2_ = uStack_e04;
  auVar20._8_2_ = uStack_df4;
  auVar20._12_2_ = uStack_df2;
  auVar20._14_2_ = uStack_e02;
  auVar19._8_8_ = uVar46;
  auVar19._0_8_ = uVar45;
  auVar52 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_d80;
  auVar18._0_2_ = uStack_d70;
  auVar18._4_2_ = uStack_d6e;
  auVar18._6_2_ = uStack_d7e;
  auVar18._10_2_ = uStack_d7c;
  auVar18._8_2_ = uStack_d6c;
  auVar18._12_2_ = uStack_d6a;
  auVar18._14_2_ = uStack_d7a;
  auVar17._8_8_ = uVar46;
  auVar17._0_8_ = uVar45;
  auVar51 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_e08;
  auVar16._0_2_ = local_df8;
  auVar16._4_2_ = uStack_df6;
  auVar16._6_2_ = uStack_e06;
  auVar16._10_2_ = uStack_e04;
  auVar16._8_2_ = uStack_df4;
  auVar16._12_2_ = uStack_df2;
  auVar16._14_2_ = uStack_e02;
  auVar15._8_8_ = uVar48;
  auVar15._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_d80;
  auVar14._0_2_ = uStack_d70;
  auVar14._4_2_ = uStack_d6e;
  auVar14._6_2_ = uStack_d7e;
  auVar14._10_2_ = uStack_d7c;
  auVar14._8_2_ = uStack_d6c;
  auVar14._12_2_ = uStack_d6a;
  auVar14._14_2_ = uStack_d7a;
  auVar13._8_8_ = uVar48;
  auVar13._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar14,auVar13);
  local_9d8 = auVar52._0_4_;
  iStack_9d4 = auVar52._4_4_;
  iStack_9d0 = auVar52._8_4_;
  iStack_9cc = auVar52._12_4_;
  local_9f8 = auVar51._0_4_;
  iStack_9f4 = auVar51._4_4_;
  iStack_9f0 = auVar51._8_4_;
  iStack_9ec = auVar51._12_4_;
  local_a18 = auVar53._0_4_;
  iStack_a14 = auVar53._4_4_;
  iStack_a10 = auVar53._8_4_;
  iStack_a0c = auVar53._12_4_;
  local_a38 = auVar54._0_4_;
  iStack_a34 = auVar54._4_4_;
  iStack_a30 = auVar54._8_4_;
  iStack_a2c = auVar54._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar40._4_4_ = iStack_9d4 + iStack_964 >> auVar52;
  auVar40._0_4_ = local_9d8 + local_968 >> auVar52;
  auVar40._12_4_ = iStack_9cc + iStack_95c >> auVar52;
  auVar40._8_4_ = iStack_9d0 + iStack_960 >> auVar52;
  auVar39._4_4_ = iStack_9f4 + iStack_964 >> auVar51;
  auVar39._0_4_ = local_9f8 + local_968 >> auVar51;
  auVar39._12_4_ = iStack_9ec + iStack_95c >> auVar51;
  auVar39._8_4_ = iStack_9f0 + iStack_960 >> auVar51;
  auVar52 = packssdw(auVar40,auVar39);
  in_RDI[0x15] = auVar52;
  auVar38._4_4_ = iStack_a14 + iStack_964 >> auVar53;
  auVar38._0_4_ = local_a18 + local_968 >> auVar53;
  auVar38._12_4_ = iStack_a0c + iStack_95c >> auVar53;
  auVar38._8_4_ = iStack_a10 + iStack_960 >> auVar53;
  auVar37._4_4_ = iStack_a34 + iStack_964 >> auVar54;
  auVar37._0_4_ = local_a38 + local_968 >> auVar54;
  auVar37._12_4_ = iStack_a2c + iStack_95c >> auVar54;
  auVar37._8_4_ = iStack_a30 + iStack_960 >> auVar54;
  auVar52 = packssdw(auVar38,auVar37);
  in_RDI[0x1a] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x16];
  uVar2 = *(undefined8 *)in_RDI[0x19];
  local_e18 = (undefined2)uVar1;
  uStack_e16 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_e14 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_e12 = (undefined2)((ulong)uVar1 >> 0x30);
  local_e28 = (undefined2)uVar2;
  uStack_e26 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_e24 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_e22 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x16] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x19] + 8);
  uStack_d90 = (undefined2)uVar1;
  uStack_d8e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_d8c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_d8a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_da0 = (undefined2)uVar2;
  uStack_d9e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_d9c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_d9a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_e28;
  auVar12._0_2_ = local_e18;
  auVar12._4_2_ = uStack_e16;
  auVar12._6_2_ = uStack_e26;
  auVar12._10_2_ = uStack_e24;
  auVar12._8_2_ = uStack_e14;
  auVar12._12_2_ = uStack_e12;
  auVar12._14_2_ = uStack_e22;
  auVar11._8_8_ = uVar46;
  auVar11._0_8_ = uVar45;
  auVar52 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_da0;
  auVar10._0_2_ = uStack_d90;
  auVar10._4_2_ = uStack_d8e;
  auVar10._6_2_ = uStack_d9e;
  auVar10._10_2_ = uStack_d9c;
  auVar10._8_2_ = uStack_d8c;
  auVar10._12_2_ = uStack_d8a;
  auVar10._14_2_ = uStack_d9a;
  auVar9._8_8_ = uVar46;
  auVar9._0_8_ = uVar45;
  auVar51 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_e28;
  auVar8._0_2_ = local_e18;
  auVar8._4_2_ = uStack_e16;
  auVar8._6_2_ = uStack_e26;
  auVar8._10_2_ = uStack_e24;
  auVar8._8_2_ = uStack_e14;
  auVar8._12_2_ = uStack_e12;
  auVar8._14_2_ = uStack_e22;
  auVar7._8_8_ = uVar48;
  auVar7._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_da0;
  auVar6._0_2_ = uStack_d90;
  auVar6._4_2_ = uStack_d8e;
  auVar6._6_2_ = uStack_d9e;
  auVar6._10_2_ = uStack_d9c;
  auVar6._8_2_ = uStack_d8c;
  auVar6._12_2_ = uStack_d8a;
  auVar6._14_2_ = uStack_d9a;
  auVar5._8_8_ = uVar48;
  auVar5._0_8_ = uVar47;
  auVar54 = pmaddwd(auVar6,auVar5);
  local_a58 = auVar52._0_4_;
  iStack_a54 = auVar52._4_4_;
  iStack_a50 = auVar52._8_4_;
  iStack_a4c = auVar52._12_4_;
  local_a78 = auVar51._0_4_;
  iStack_a74 = auVar51._4_4_;
  iStack_a70 = auVar51._8_4_;
  iStack_a6c = auVar51._12_4_;
  local_a98 = auVar53._0_4_;
  iStack_a94 = auVar53._4_4_;
  iStack_a90 = auVar53._8_4_;
  iStack_a8c = auVar53._12_4_;
  local_ab8 = auVar54._0_4_;
  iStack_ab4 = auVar54._4_4_;
  iStack_ab0 = auVar54._8_4_;
  iStack_aac = auVar54._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar36._4_4_ = iStack_a54 + iStack_964 >> auVar52;
  auVar36._0_4_ = local_a58 + local_968 >> auVar52;
  auVar36._12_4_ = iStack_a4c + iStack_95c >> auVar52;
  auVar36._8_4_ = iStack_a50 + iStack_960 >> auVar52;
  auVar35._4_4_ = iStack_a74 + iStack_964 >> auVar51;
  auVar35._0_4_ = local_a78 + local_968 >> auVar51;
  auVar35._12_4_ = iStack_a6c + iStack_95c >> auVar51;
  auVar35._8_4_ = iStack_a70 + iStack_960 >> auVar51;
  auVar52 = packssdw(auVar36,auVar35);
  in_RDI[0x16] = auVar52;
  auVar34._4_4_ = iStack_a94 + iStack_964 >> auVar53;
  auVar34._0_4_ = local_a98 + local_968 >> auVar53;
  auVar34._12_4_ = iStack_a8c + iStack_95c >> auVar53;
  auVar34._8_4_ = iStack_a90 + iStack_960 >> auVar53;
  auVar33._4_4_ = iStack_ab4 + iStack_964 >> auVar54;
  auVar33._0_4_ = local_ab8 + local_968 >> auVar54;
  auVar33._12_4_ = iStack_aac + iStack_95c >> auVar54;
  auVar33._8_4_ = iStack_ab0 + iStack_960 >> auVar54;
  auVar52 = packssdw(auVar34,auVar33);
  in_RDI[0x19] = auVar52;
  uVar1 = *(undefined8 *)in_RDI[0x17];
  uVar2 = *(undefined8 *)in_RDI[0x18];
  local_e38 = (undefined2)uVar1;
  uStack_e36 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_e34 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_e32 = (undefined2)((ulong)uVar1 >> 0x30);
  local_e48 = (undefined2)uVar2;
  uStack_e46 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_e44 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_e42 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI[0x17] + 8);
  uVar2 = *(undefined8 *)(in_RDI[0x18] + 8);
  uStack_db0 = (undefined2)uVar1;
  uStack_dae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_dac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_daa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_dc0 = (undefined2)uVar2;
  uStack_dbe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_dbc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_dba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_e48;
  auVar4._0_2_ = local_e38;
  auVar4._4_2_ = uStack_e36;
  auVar4._6_2_ = uStack_e46;
  auVar4._10_2_ = uStack_e44;
  auVar4._8_2_ = uStack_e34;
  auVar4._12_2_ = uStack_e32;
  auVar4._14_2_ = uStack_e42;
  auVar55._8_8_ = uVar46;
  auVar55._0_8_ = uVar45;
  auVar55 = pmaddwd(auVar4,auVar55);
  auVar3._2_2_ = uStack_dc0;
  auVar3._0_2_ = uStack_db0;
  auVar3._4_2_ = uStack_dae;
  auVar3._6_2_ = uStack_dbe;
  auVar3._10_2_ = uStack_dbc;
  auVar3._8_2_ = uStack_dac;
  auVar3._12_2_ = uStack_daa;
  auVar3._14_2_ = uStack_dba;
  auVar56._8_8_ = uVar46;
  auVar56._0_8_ = uVar45;
  auVar56 = pmaddwd(auVar3,auVar56);
  auVar54._2_2_ = local_e48;
  auVar54._0_2_ = local_e38;
  auVar54._4_2_ = uStack_e36;
  auVar54._6_2_ = uStack_e46;
  auVar54._10_2_ = uStack_e44;
  auVar54._8_2_ = uStack_e34;
  auVar54._12_2_ = uStack_e32;
  auVar54._14_2_ = uStack_e42;
  auVar53._8_8_ = uVar48;
  auVar53._0_8_ = uVar47;
  auVar53 = pmaddwd(auVar54,auVar53);
  auVar51._2_2_ = uStack_dc0;
  auVar51._0_2_ = uStack_db0;
  auVar51._4_2_ = uStack_dae;
  auVar51._6_2_ = uStack_dbe;
  auVar51._10_2_ = uStack_dbc;
  auVar51._8_2_ = uStack_dac;
  auVar51._12_2_ = uStack_daa;
  auVar51._14_2_ = uStack_dba;
  auVar52._8_8_ = uVar48;
  auVar52._0_8_ = uVar47;
  auVar52 = pmaddwd(auVar51,auVar52);
  local_ad8 = auVar55._0_4_;
  iStack_ad4 = auVar55._4_4_;
  iStack_ad0 = auVar55._8_4_;
  iStack_acc = auVar55._12_4_;
  local_af8 = auVar56._0_4_;
  iStack_af4 = auVar56._4_4_;
  iStack_af0 = auVar56._8_4_;
  iStack_aec = auVar56._12_4_;
  local_b18 = auVar53._0_4_;
  iStack_b14 = auVar53._4_4_;
  iStack_b10 = auVar53._8_4_;
  iStack_b0c = auVar53._12_4_;
  local_b38 = auVar52._0_4_;
  iStack_b34 = auVar52._4_4_;
  iStack_b30 = auVar52._8_4_;
  iStack_b2c = auVar52._12_4_;
  auVar52 = ZEXT416((uint)(int)in_DL);
  auVar51 = ZEXT416((uint)(int)in_DL);
  auVar53 = ZEXT416((uint)(int)in_DL);
  auVar54 = ZEXT416((uint)(int)in_DL);
  auVar32._4_4_ = iStack_ad4 + iStack_964 >> auVar52;
  auVar32._0_4_ = local_ad8 + local_968 >> auVar52;
  auVar32._12_4_ = iStack_acc + iStack_95c >> auVar52;
  auVar32._8_4_ = iStack_ad0 + iStack_960 >> auVar52;
  auVar31._4_4_ = iStack_af4 + iStack_964 >> auVar51;
  auVar31._0_4_ = local_af8 + local_968 >> auVar51;
  auVar31._12_4_ = iStack_aec + iStack_95c >> auVar51;
  auVar31._8_4_ = iStack_af0 + iStack_960 >> auVar51;
  auVar52 = packssdw(auVar32,auVar31);
  in_RDI[0x17] = auVar52;
  auVar30._4_4_ = iStack_b14 + iStack_964 >> auVar53;
  auVar30._0_4_ = local_b18 + local_968 >> auVar53;
  auVar30._12_4_ = iStack_b0c + iStack_95c >> auVar53;
  auVar30._8_4_ = iStack_b10 + iStack_960 >> auVar53;
  auVar29._4_4_ = iStack_b34 + iStack_964 >> auVar54;
  auVar29._0_4_ = local_b38 + local_968 >> auVar54;
  auVar29._12_4_ = iStack_b2c + iStack_95c >> auVar54;
  auVar29._8_4_ = iStack_b30 + iStack_960 >> auVar54;
  auVar52 = packssdw(auVar30,auVar29);
  in_RDI[0x18] = auVar52;
  auVar52 = in_RDI[0x20];
  auVar51 = paddsw(in_RDI[0x20],in_RDI[0x2f]);
  in_RDI[0x20] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x2f]);
  in_RDI[0x2f] = auVar52;
  auVar52 = in_RDI[0x21];
  auVar51 = paddsw(in_RDI[0x21],in_RDI[0x2e]);
  in_RDI[0x21] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x2e]);
  in_RDI[0x2e] = auVar52;
  auVar52 = in_RDI[0x22];
  auVar51 = paddsw(in_RDI[0x22],in_RDI[0x2d]);
  in_RDI[0x22] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x2d]);
  in_RDI[0x2d] = auVar52;
  auVar52 = in_RDI[0x23];
  auVar51 = paddsw(in_RDI[0x23],in_RDI[0x2c]);
  in_RDI[0x23] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x2c]);
  in_RDI[0x2c] = auVar52;
  auVar52 = in_RDI[0x24];
  auVar51 = paddsw(in_RDI[0x24],in_RDI[0x2b]);
  in_RDI[0x24] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x2b]);
  in_RDI[0x2b] = auVar52;
  auVar52 = in_RDI[0x25];
  auVar51 = paddsw(in_RDI[0x25],in_RDI[0x2a]);
  in_RDI[0x25] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x2a]);
  in_RDI[0x2a] = auVar52;
  auVar52 = in_RDI[0x26];
  auVar51 = paddsw(in_RDI[0x26],in_RDI[0x29]);
  in_RDI[0x26] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x29]);
  in_RDI[0x29] = auVar52;
  auVar52 = in_RDI[0x27];
  auVar51 = paddsw(in_RDI[0x27],in_RDI[0x28]);
  in_RDI[0x27] = auVar51;
  auVar52 = psubsw(auVar52,in_RDI[0x28]);
  in_RDI[0x28] = auVar52;
  auVar52 = in_RDI[0x30];
  auVar51 = psubsw(in_RDI[0x3f],in_RDI[0x30]);
  in_RDI[0x30] = auVar51;
  auVar52 = paddsw(in_RDI[0x3f],auVar52);
  in_RDI[0x3f] = auVar52;
  auVar52 = in_RDI[0x31];
  auVar51 = psubsw(in_RDI[0x3e],in_RDI[0x31]);
  in_RDI[0x31] = auVar51;
  auVar52 = paddsw(in_RDI[0x3e],auVar52);
  in_RDI[0x3e] = auVar52;
  auVar52 = in_RDI[0x32];
  auVar51 = psubsw(in_RDI[0x3d],in_RDI[0x32]);
  in_RDI[0x32] = auVar51;
  auVar52 = paddsw(in_RDI[0x3d],auVar52);
  in_RDI[0x3d] = auVar52;
  auVar52 = in_RDI[0x33];
  auVar51 = psubsw(in_RDI[0x3c],in_RDI[0x33]);
  in_RDI[0x33] = auVar51;
  auVar52 = paddsw(in_RDI[0x3c],auVar52);
  in_RDI[0x3c] = auVar52;
  auVar52 = in_RDI[0x34];
  auVar51 = psubsw(in_RDI[0x3b],in_RDI[0x34]);
  in_RDI[0x34] = auVar51;
  auVar52 = paddsw(in_RDI[0x3b],auVar52);
  in_RDI[0x3b] = auVar52;
  auVar52 = in_RDI[0x35];
  auVar51 = psubsw(in_RDI[0x3a],in_RDI[0x35]);
  in_RDI[0x35] = auVar51;
  auVar52 = paddsw(in_RDI[0x3a],auVar52);
  in_RDI[0x3a] = auVar52;
  auVar52 = in_RDI[0x36];
  auVar51 = psubsw(in_RDI[0x39],in_RDI[0x36]);
  in_RDI[0x36] = auVar51;
  auVar52 = paddsw(in_RDI[0x39],auVar52);
  in_RDI[0x39] = auVar52;
  auVar52 = in_RDI[0x37];
  auVar51 = psubsw(in_RDI[0x38],in_RDI[0x37]);
  in_RDI[0x37] = auVar51;
  auVar52 = paddsw(in_RDI[0x38],auVar52);
  in_RDI[0x38] = auVar52;
  return;
}

Assistant:

static inline void idct64_stage9_sse2(__m128i *x, const int32_t *cospi,
                                      const __m128i __rounding,
                                      int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[15]);
  btf_16_adds_subs_sse2(x[1], x[14]);
  btf_16_adds_subs_sse2(x[2], x[13]);
  btf_16_adds_subs_sse2(x[3], x[12]);
  btf_16_adds_subs_sse2(x[4], x[11]);
  btf_16_adds_subs_sse2(x[5], x[10]);
  btf_16_adds_subs_sse2(x[6], x[9]);
  btf_16_adds_subs_sse2(x[7], x[8]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[20], x[27], x[20], x[27]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[21], x[26], x[21], x[26]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[22], x[25], x[22], x[25]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[23], x[24], x[23], x[24]);
  btf_16_adds_subs_sse2(x[32], x[47]);
  btf_16_adds_subs_sse2(x[33], x[46]);
  btf_16_adds_subs_sse2(x[34], x[45]);
  btf_16_adds_subs_sse2(x[35], x[44]);
  btf_16_adds_subs_sse2(x[36], x[43]);
  btf_16_adds_subs_sse2(x[37], x[42]);
  btf_16_adds_subs_sse2(x[38], x[41]);
  btf_16_adds_subs_sse2(x[39], x[40]);
  btf_16_subs_adds_sse2(x[63], x[48]);
  btf_16_subs_adds_sse2(x[62], x[49]);
  btf_16_subs_adds_sse2(x[61], x[50]);
  btf_16_subs_adds_sse2(x[60], x[51]);
  btf_16_subs_adds_sse2(x[59], x[52]);
  btf_16_subs_adds_sse2(x[58], x[53]);
  btf_16_subs_adds_sse2(x[57], x[54]);
  btf_16_subs_adds_sse2(x[56], x[55]);
}